

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::activateLinkUnderCursor(QWidgetTextControlPrivate *this,QString href)

{
  QTextCursor *pQVar1;
  QArrayData *pQVar2;
  QString *pQVar3;
  undefined1 *puVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  MoveMode MVar10;
  int iVar11;
  QString *in_RSI;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QTextCursor oldCursor;
  QTextCursor tmp;
  int local_e4;
  QArrayData *local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined1 *local_a0;
  QTextFormat local_98 [16];
  QArrayData *local_88;
  storage_type_conflict *psStack_80;
  int local_78;
  undefined4 uStack_74;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [12];
  int iStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = &this->cursor;
  QTextCursor::QTextCursor((QTextCursor *)&local_a0,pQVar1);
  if (*(long *)(in_RSI + 0x10) == 0) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_68,pQVar1);
    iVar8 = QTextCursor::selectionStart();
    iVar9 = QTextCursor::position();
    if (iVar8 != iVar9) {
      MVar10 = QTextCursor::selectionStart();
      QTextCursor::setPosition((int)&local_68,MVar10);
    }
    QTextCursor::movePosition((MoveOperation)&local_68,0x11,0);
    QTextCursor::charFormat();
    QTextFormat::stringProperty((int)local_58);
    pQVar2 = *(QArrayData **)in_RSI;
    pQVar3 = *(QString **)(in_RSI + 8);
    *(undefined8 *)in_RSI = local_58._0_8_;
    *(QString **)(in_RSI + 8) = stack0xffffffffffffffb0;
    puVar4 = *(undefined1 **)(in_RSI + 0x10);
    *(undefined1 **)(in_RSI + 0x10) = local_48;
    local_58._0_8_ = pQVar2;
    unique0x10000827 = pQVar3;
    local_48 = puVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)&local_88);
    QTextCursor::~QTextCursor((QTextCursor *)&local_68);
  }
  if (*(long *)(in_RSI + 0x10) != 0) {
    cVar6 = QTextCursor::hasSelection();
    if (cVar6 == '\0') {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::block();
      iVar8 = QTextCursor::position();
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffb0 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::begin();
      if ((int)local_48 == iStack_4c) {
        local_d0._0_4_ = 0;
        local_e4 = 0;
        local_d8 = (QArrayData *)0x0;
        local_c8._0_4_ = 0;
      }
      else {
        local_c8 = 0;
        local_d8 = (QArrayData *)0x0;
        local_e4 = 0;
        local_d0 = 0;
        do {
          local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          psStack_80 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QTextBlock::iterator::fragment();
          iVar9 = QTextFragment::position();
          bVar5 = true;
          if (iVar9 <= iVar8) {
            iVar11 = QTextFragment::length();
            if (iVar8 < iVar11 + iVar9) {
              local_d8 = (QArrayData *)local_58._0_8_;
              local_e4 = local_58._8_4_;
              local_d0 = (ulong)stack0xffffffffffffffb0 >> 0x20;
              local_c8 = (ulong)local_48 & 0xffffffff;
              bVar5 = false;
            }
          }
          if (!bVar5) break;
          QTextBlock::iterator::operator++((iterator *)local_58);
        } while ((int)local_48 != iStack_4c);
      }
      if ((int)local_c8 != (int)local_d0) {
        local_58._0_8_ = local_d8;
        iStack_4c = (int)local_d0;
        local_58._8_4_ = local_e4;
        local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_c8);
        QTextBlock::iterator::fragment();
        MVar10 = QTextFragment::position();
        iVar8 = (int)pQVar1;
        QTextCursor::setPosition(iVar8,MVar10);
        QTextBlock::begin();
        if (((QArrayData *)local_58._0_8_ != local_88) || ((int)local_48 != local_78)) {
          do {
            QTextBlock::iterator::operator--((iterator *)local_58);
            QTextBlock::iterator::fragment();
            QTextFragment::charFormat();
            QTextFormat::stringProperty((int)&local_88);
            bVar7 = 1;
            if (CONCAT44(uStack_74,local_78) == *(long *)(in_RSI + 0x10)) {
              QVar12.m_data = psStack_80;
              QVar12.m_size = CONCAT44(uStack_74,local_78);
              QVar14.m_data = *(storage_type_conflict **)(in_RSI + 8);
              QVar14.m_size = *(long *)(in_RSI + 0x10);
              bVar7 = QtPrivate::equalStrings(QVar12,QVar14);
              bVar7 = bVar7 ^ 1;
            }
            if (local_88 != (QArrayData *)0x0) {
              LOCK();
              (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_88,2,0x10);
              }
            }
            QTextFormat::~QTextFormat(local_98);
            if (bVar7 != 0) break;
            MVar10 = QTextFragment::position();
            QTextCursor::setPosition(iVar8,MVar10);
            QTextBlock::begin();
          } while (((QArrayData *)local_58._0_8_ != local_88) || ((int)local_48 != local_78));
        }
        local_58._0_8_ = local_d8;
        stack0xffffffffffffffb0 = (QString *)CONCAT44((int)local_d0,local_e4);
        local_48 = (undefined1 *)CONCAT44(local_48._4_4_,(int)local_c8);
        if ((int)local_c8 != (int)local_d0) {
          do {
            QTextBlock::iterator::fragment();
            QTextFragment::charFormat();
            QTextFormat::stringProperty((int)&local_88);
            bVar7 = 1;
            if (CONCAT44(uStack_74,local_78) == *(long *)(in_RSI + 0x10)) {
              QVar13.m_data = psStack_80;
              QVar13.m_size = CONCAT44(uStack_74,local_78);
              QVar15.m_data = *(storage_type_conflict **)(in_RSI + 8);
              QVar15.m_size = *(long *)(in_RSI + 0x10);
              bVar7 = QtPrivate::equalStrings(QVar13,QVar15);
              bVar7 = bVar7 ^ 1;
            }
            if (local_88 != (QArrayData *)0x0) {
              LOCK();
              (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_88,2,0x10);
              }
            }
            QTextFormat::~QTextFormat(local_98);
            if (bVar7 != 0) break;
            iVar9 = QTextFragment::position();
            iVar11 = QTextFragment::length();
            QTextCursor::setPosition(iVar8,iVar9 + iVar11);
            QTextBlock::iterator::operator++((iterator *)local_58);
          } while ((int)local_48 != iStack_4c);
        }
      }
    }
    if (this->hasFocus == true) {
      this->cursorIsFocusIndicator = true;
    }
    else {
      this->cursorIsFocusIndicator = false;
      QTextCursor::clearSelection();
    }
    repaintOldAndNewSelection(this,(QTextCursor *)&local_a0);
    if (this->openExternalLinks == true) {
      QUrl::QUrl((QUrl *)local_58,in_RSI,TolerantMode);
      QDesktopServices::openUrl((QUrl *)local_58);
      QUrl::~QUrl((QUrl *)local_58);
    }
    else {
      local_58._0_8_ = (QArrayData *)0x0;
      unique0x1000081f = in_RSI;
      QMetaObject::activate
                (*(QObject **)&this->field_0x8,&QWidgetTextControl::staticMetaObject,0xd,
                 (void **)local_58);
    }
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::activateLinkUnderCursor(QString href)
{
    QTextCursor oldCursor = cursor;

    if (href.isEmpty()) {
        QTextCursor tmp = cursor;
        if (tmp.selectionStart() != tmp.position())
            tmp.setPosition(tmp.selectionStart());
        tmp.movePosition(QTextCursor::NextCharacter);
        href = tmp.charFormat().anchorHref();
    }
    if (href.isEmpty())
        return;

    if (!cursor.hasSelection()) {
        QTextBlock block = cursor.block();
        const int cursorPos = cursor.position();

        QTextBlock::Iterator it = block.begin();
        QTextBlock::Iterator linkFragment;

        for (; !it.atEnd(); ++it) {
            QTextFragment fragment = it.fragment();
            const int fragmentPos = fragment.position();
            if (fragmentPos <= cursorPos &&
                fragmentPos + fragment.length() > cursorPos) {
                linkFragment = it;
                break;
            }
        }

        if (!linkFragment.atEnd()) {
            it = linkFragment;
            cursor.setPosition(it.fragment().position());
            if (it != block.begin()) {
                do {
                    --it;
                    QTextFragment fragment = it.fragment();
                    if (fragment.charFormat().anchorHref() != href)
                        break;
                    cursor.setPosition(fragment.position());
                } while (it != block.begin());
            }

            for (it = linkFragment; !it.atEnd(); ++it) {
                QTextFragment fragment = it.fragment();
                if (fragment.charFormat().anchorHref() != href)
                    break;
                cursor.setPosition(fragment.position() + fragment.length(), QTextCursor::KeepAnchor);
            }
        }
    }

    if (hasFocus) {
        cursorIsFocusIndicator = true;
    } else {
        cursorIsFocusIndicator = false;
        cursor.clearSelection();
    }
    repaintOldAndNewSelection(oldCursor);

#ifndef QT_NO_DESKTOPSERVICES
    if (openExternalLinks)
        QDesktopServices::openUrl(href);
    else
#endif
        emit q_func()->linkActivated(href);
}